

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Type(RecyclableObjectDisplay *this)

{
  char16 c;
  Var aValue;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *originalInstance;
  JavascriptFunction *this_01;
  FunctionProxy *pFVar6;
  ParseableFunctionInfo *pPVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  Var local_28;
  Var value;
  
  aValue = this->instance;
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)aValue >> 0x32 == 0 && ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      originalInstance = VarTo<Js::RecyclableObject>(aValue);
      this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
                stringBuilder;
      this_00->length = 0;
      this_00->count = 0;
      this_00->lastChunk = (Data *)0x0;
      this_00->firstChunk = (Data *)0x0;
      this_00->secondChunk = (Data *)0x0;
      local_28 = (Var)0x0;
      if ((((originalInstance->type).ptr)->typeId == TypeIds_Object) &&
         (BVar3 = GetPropertyWithScriptEnter
                            (originalInstance,originalInstance,0x67,&local_28,this->scriptContext),
         BVar3 != 0)) {
        StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>
                  (this_00,(char16 (*) [7])0x11b672e);
        bVar2 = VarIs<Js::JavascriptFunction>(local_28);
        if (bVar2) {
          this_01 = VarTo<Js::JavascriptFunction>(local_28);
          pFVar6 = JavascriptFunction::GetFunctionProxy(this_01);
          if (pFVar6 != (FunctionProxy *)0x0) {
            pFVar6 = JavascriptFunction::GetFunctionProxy(this_01);
            pPVar7 = FunctionProxy::EnsureDeserialized(pFVar6);
            if (pPVar7 != (ParseableFunctionInfo *)0x0) {
              iVar4 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar7);
              pcVar8 = (char16 *)CONCAT44(extraout_var,iVar4);
              if (pcVar8 != (char16 *)0x0) {
                StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
                          (this_00,(char16 (*) [4])L", (");
                c = *pcVar8;
                while (c != L'\0') {
                  pcVar8 = pcVar8 + 1;
                  StringBuilder<Memory::ArenaAllocator>::Append(this_00,c);
                  c = *pcVar8;
                }
                StringBuilder<Memory::ArenaAllocator>::Append(this_00,L')');
              }
            }
          }
        }
      }
      else {
        iVar4 = (*(originalInstance->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x51])(originalInstance,this_00,this->scriptContext);
        if (iVar4 == 0) {
          return L"Undefined";
        }
      }
      pcVar8 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
      return pcVar8;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return L"Number";
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Type()
    {
        LPCWSTR typeStr;

        if(Js::TaggedInt::Is(instance) || Js::JavascriptNumber::Is(instance))
        {
            typeStr = _u("Number");
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            // For the RecyclableObject try to find out the constructor, which will be shown as type for the object.
            // This case is to handle the user defined function, built in objects have dedicated classes to handle.

            Var value = nullptr;
            TypeId typeId = obj->GetTypeId();
            if (typeId == TypeIds_Object && GetPropertyWithScriptEnter(obj, obj, PropertyIds::constructor, &value, scriptContext))
            {
                builder->AppendCppLiteral(_u("Object"));
                if (Js::VarIs<Js::JavascriptFunction>(value))
                {
                    Js::JavascriptFunction *pfunction = Js::VarTo<Js::JavascriptFunction>(value);
                    // For an odd chance that the constructor wasn't called to create the object.
                    Js::ParseableFunctionInfo *pFuncBody = pfunction->GetFunctionProxy() != nullptr ? pfunction->GetFunctionProxy()->EnsureDeserialized() : nullptr;
                    if (pFuncBody)
                    {
                        const char16* pDisplayName = pFuncBody->GetDisplayName();
                        if (pDisplayName)
                        {
                            builder->AppendCppLiteral(_u(", ("));
                            builder->AppendSz(pDisplayName);
                            builder->Append(_u(')'));
                        }
                    }
                }
                typeStr = builder->Detach();
            }
            else if (obj->GetDiagTypeString(builder, scriptContext))
            {
                typeStr = builder->Detach();
            }
            else
            {
                typeStr = _u("Undefined");
            }
        }

        return typeStr;
    }